

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

void __thiscall QDockWidget::paintEvent(QDockWidget *this,QPaintEvent *event)

{
  long lVar1;
  QLayoutItem *pQVar2;
  QWidgetData *pQVar3;
  undefined1 *puVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  QDockWidgetLayout *this_00;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  bool bVar8;
  QStyleOptionDockWidget titleOpt;
  undefined1 *local_c8;
  QDockWidget *pQStack_c0;
  QStyle *local_b8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QWidget::layout(&this->super_QWidget);
  this_00 = (QDockWidgetLayout *)QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
  pQVar2 = (this_00->item_list).d.ptr[3];
  if (pQVar2 == (QLayoutItem *)0x0) {
    bVar8 = true;
  }
  else {
    iVar7 = (*pQVar2->_vptr_QLayoutItem[0xd])();
    bVar8 = CONCAT44(extraout_var,iVar7) == 0;
  }
  bVar5 = QDockWidgetLayout::nativeWindowDeco(this_00);
  if ((bVar8) && (!bVar5)) {
    local_b8 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_c0 = (QDockWidget *)&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_c8);
    pQStack_c0 = this;
    local_b8 = QWidget::style(&this->super_QWidget);
    QPainter::begin((QPaintDevice *)&local_c8);
    QPainter::setRenderHint((RenderHint)&local_c8,true);
    if (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)local_98);
      QStyleOption::initFrom((QStyleOption *)local_98,&this->super_QWidget);
      (**(code **)(*(long *)local_b8 + 0xb0))
                (local_b8,2,(QStyleOptionFrame *)local_98,&local_c8,pQStack_c0);
      QStyleOption::~QStyleOption((QStyleOption *)local_98);
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionDockWidget::QStyleOptionDockWidget((QStyleOptionDockWidget *)local_98);
    (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,(QStyleOptionDockWidget *)local_98);
    pQVar3 = (this->super_QWidget).data;
    QApplication::font((QApplication *)local_a8,"QDockWidget");
    cVar6 = QFont::operator==(&pQVar3->fnt,(QFont *)local_a8);
    QFont::~QFont((QFont *)local_a8);
    if (cVar6 != '\0') {
      QFontMetrics::QFontMetrics((QFontMetrics *)local_a8,(QFont *)(lVar1 + 0x268));
      puVar4 = local_78;
      local_78 = local_a8[0];
      local_a8[0] = puVar4;
      QFontMetrics::~QFontMetrics((QFontMetrics *)local_a8);
      QPainter::setFont((QFont *)&local_c8);
    }
    (**(code **)(*(long *)local_b8 + 0xb8))(local_b8,0x1e,local_98,&local_c8,pQStack_c0);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_98);
    QPainter::~QPainter((QPainter *)&local_c8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidget::paintEvent(QPaintEvent *event)
{
    Q_UNUSED(event);
    Q_D(QDockWidget);

    QDockWidgetLayout *layout
        = qobject_cast<QDockWidgetLayout*>(this->layout());
    bool customTitleBar = layout->widgetForRole(QDockWidgetLayout::TitleBar) != nullptr;
    bool nativeDeco = layout->nativeWindowDeco();

    if (!nativeDeco && !customTitleBar) {
        QStylePainter p(this);
        // ### Add PixelMetric to change spacers, so style may show border
        // when not floating.
        if (isFloating()) {
            QStyleOptionFrame framOpt;
            framOpt.initFrom(this);
            p.drawPrimitive(QStyle::PE_FrameDockWidget, framOpt);
        }

        // Title must be painted after the frame, since the areas overlap, and
        // the title may wish to extend out to all sides (eg. Vista style)
        QStyleOptionDockWidget titleOpt;
        initStyleOption(&titleOpt);
        if (font() == QApplication::font("QDockWidget")) {
            titleOpt.fontMetrics = QFontMetrics(d->font);
            p.setFont(d->font);
        }

        p.drawControl(QStyle::CE_DockWidgetTitle, titleOpt);
    }
}